

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  char cVar2;
  Box *pBVar3;
  Sphere *this;
  double *pdVar4;
  ulong uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Dd_00;
  allocator<char> local_589;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> geometry;
  Vector4d local_568;
  ulong local_548;
  PointerType local_540;
  undefined1 local_538 [16];
  Vector4f local_528;
  undefined1 local_518 [16];
  Affine3d T;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_488 [8];
  undefined8 local_480;
  undefined8 uStack_478;
  AngleAxis<double> local_468;
  Matrix<double,_4,_4,_0,_4,_4> local_448 [2];
  Mat Depthmap;
  Affine3d Tcam;
  undefined1 local_208 [8];
  undefined1 auStack_200 [8];
  XprTypeNested local_1f8;
  variable_if_dynamic<long,__1> local_1f0;
  variable_if_dynamic<long,__1> vStack_1e8;
  Index local_1e0;
  _InputArray local_a8 [24];
  Mat Normalmap;
  
  geometry.super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  geometry.super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  geometry.super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Eigen::Transform<double,_3,_2,_0>::Identity();
  local_208 = (undefined1  [8])0x0;
  pdVar4 = T.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array + 0xc;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = 0.0;
  auStack_200 = (undefined1  [8])0x0;
  local_1f8 = (XprTypeNested)0xbff0000000000000;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)pdVar4;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = (double)&T;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)local_448,
             (Matrix<double,_3,_1,_0,_3,_1> *)local_208);
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       4.0;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       4.0;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       8.0;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       0.0;
  pBVar3 = (Box *)operator_new(0xb0);
  sdf::Box::Box(pBVar3,bool_union,&T,&local_568,true);
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)pBVar3;
  std::vector<sdf::Primitive*,std::allocator<sdf::Primitive*>>::emplace_back<sdf::Primitive*>
            ((vector<sdf::Primitive*,std::allocator<sdf::Primitive*>> *)&geometry,
             (Primitive **)local_448);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>>
            (&T.m_matrix,local_448);
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       2.0;
  local_208 = (undefined1  [8])0xbff0000000000000;
  local_1f8 = (XprTypeNested)0x400199999999999a;
  auStack_200 = (undefined1  [8])0x3ff0000000000000;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = 0.0;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       0.5;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)pdVar4;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = (double)&T;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)local_448,
             (Matrix<double,_3,_1,_0,_3,_1> *)local_208);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&Tcam,
             (DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&Depthmap);
  Tcam.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = -0.5235987755982988;
  Eigen::AngleAxis<double>::toRotationMatrix((Matrix3 *)local_448,(AngleAxis<double> *)&Tcam);
  local_1f0.m_value = 0;
  vStack_1e8.m_value = 0;
  local_1e0 = 4;
  local_208 = (undefined1  [8])&T;
  local_1f8 = &T.m_matrix;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false> *)local_208,
             (Matrix<double,_3,_3,_0,_3,_3> *)local_448);
  pBVar3 = (Box *)operator_new(0xb0);
  sdf::Box::Box(pBVar3,bool_union,&T,&local_568,false);
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)pBVar3;
  std::vector<sdf::Primitive*,std::allocator<sdf::Primitive*>>::emplace_back<sdf::Primitive*>
            ((vector<sdf::Primitive*,std::allocator<sdf::Primitive*>> *)&geometry,
             (Primitive **)local_448);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>>
            (&T.m_matrix,local_448);
  local_208 = (undefined1  [8])0x3ff0000000000000;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = 0.0;
  auStack_200 = (undefined1  [8])0x3ff8000000000000;
  local_1f8 = (XprTypeNested)0x4000000000000000;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)pdVar4;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = (double)&T;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)local_448,
             (Matrix<double,_3,_1,_0,_3,_1> *)local_208);
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       0.5;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       0.0;
  this = (Sphere *)operator_new(0xb0);
  sdf::Sphere::Sphere(this,bool_union,&T,&local_568,false);
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)this;
  std::vector<sdf::Primitive*,std::allocator<sdf::Primitive*>>::emplace_back<sdf::Primitive*>
            ((vector<sdf::Primitive*,std::allocator<sdf::Primitive*>> *)&geometry,
             (Primitive **)local_448);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>>
            (&T.m_matrix,local_448);
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       0.6;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       0.6;
  local_208 = (undefined1  [8])0x3fe0000000000000;
  local_1f8 = (XprTypeNested)0x3fe0000000000000;
  auStack_200 = (undefined1  [8])0x3ff6666666666666;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = 0.0;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       0.6;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)pdVar4;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = (double)&T;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)local_448,
             (Matrix<double,_3,_1,_0,_3,_1> *)local_208);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&Tcam,
             (DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&Depthmap);
  Tcam.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = 0.17453292519943295;
  Eigen::AngleAxis<double>::toRotationMatrix((Matrix3 *)local_448,(AngleAxis<double> *)&Tcam);
  local_1f0.m_value = 0;
  vStack_1e8.m_value = 0;
  local_1e0 = 4;
  local_208 = (undefined1  [8])&T;
  local_1f8 = &T.m_matrix;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false> *)local_208,
             (Matrix<double,_3,_3,_0,_3,_3> *)local_448);
  pBVar3 = (Box *)operator_new(0xb0);
  sdf::Box::Box(pBVar3,bool_union,&T,&local_568,false);
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)pBVar3;
  std::vector<sdf::Primitive*,std::allocator<sdf::Primitive*>>::emplace_back<sdf::Primitive*>
            ((vector<sdf::Primitive*,std::allocator<sdf::Primitive*>> *)&geometry,
             (Primitive **)local_448);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>>
            (&T.m_matrix,local_448);
  local_208 = (undefined1  [8])0x3fe0000000000000;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = 0.0;
  _auStack_200 = ZEXT816(0x4002000000000000) << 0x40;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)pdVar4;
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = (double)&T;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)local_448,
             (Matrix<double,_3,_1,_0,_3,_1> *)local_208);
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       0.5;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       0.1;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_568.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       0.0;
  pdVar4 = (double *)operator_new(0xb0);
  sdf::Torus::Torus((Torus *)pdVar4,bool_union,&T,&local_568,false);
  local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)pdVar4;
  std::vector<sdf::Primitive*,std::allocator<sdf::Primitive*>>::emplace_back<sdf::Primitive*>
            ((vector<sdf::Primitive*,std::allocator<sdf::Primitive*>> *)&geometry,
             (Primitive **)local_448);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  local_528.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       300.0;
  local_528.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       300.0;
  local_528.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       319.5;
  local_528.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       239.5;
  cv::Mat::Mat(&Depthmap);
  cv::Mat::Mat(&Normalmap);
  uVar5 = 0xffffff2e;
  uVar6 = extraout_XMM0_Dc;
  uVar7 = extraout_XMM0_Dd;
  while( true ) {
    if ((int)uVar5 == 0) {
      cv::waitKey(0);
      cv::Mat::~Mat(&Normalmap);
      cv::Mat::~Mat(&Depthmap);
      std::_Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::~_Vector_base
                (&geometry.super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>);
      return 0;
    }
    dVar1 = (double)((int)uVar5 + 0x3c);
    local_538._8_4_ = uVar6;
    local_538._0_8_ = dVar1;
    local_538._12_4_ = uVar7;
    dVar1 = (dVar1 * 12.566370614359172) / 180.0;
    local_518._8_4_ = uVar6;
    local_518._0_8_ = dVar1;
    local_518._12_4_ = uVar7;
    local_548 = uVar5;
    local_540 = (PointerType)cos(dVar1);
    dVar1 = sin((double)local_518._0_8_);
    local_208 = (undefined1  [8])local_540;
    local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
    [0] = (double)(Tcam.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                   m_storage.m_data.array + 0xc);
    local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
    [3] = 0.0;
    unique0x100005ca = SUB84((double)local_538._0_8_ * 0.01,0);
    auStack_200 = (undefined1  [8])(dVar1 * 0.6);
    unique0x100005ce = (int)((ulong)((double)local_538._0_8_ * 0.01) >> 0x20);
    local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
    [4] = 1.48219693752374e-323;
    local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
    [5] = 1.97626258336499e-323;
    local_448[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
    [2] = (double)&Tcam;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)local_448,
               (Matrix<double,_3,_1,_0,_3,_1> *)local_208);
    local_480 = 0;
    uStack_478 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_468,local_488);
    local_468.m_angle = ((double)local_538._0_8_ * 3.141592653589793) / 50.0;
    Eigen::AngleAxis<double>::toRotationMatrix((Matrix3 *)local_448,&local_468);
    local_1f8 = &T.m_matrix;
    local_1f0.m_value = 0;
    vStack_1e8.m_value = 0;
    local_1e0 = 4;
    local_208 = (undefined1  [8])&T;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
              ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false> *)local_208,
               (Matrix<double,_3,_3,_0,_3,_3> *)local_448);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>>
              (&(geometry.super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[4]->transformation).m_matrix,&T.m_matrix);
    sdf::RenderNormal(&Tcam,0x1e0,0x280,&local_528,0x20,10.0,0.05,&geometry,&Normalmap);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"Normals",&local_589);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_488,0.5);
    cv::operator*((Mat *)local_208,0.5);
    cv::operator-((Scalar_ *)local_448,(MatExpr *)local_488);
    cv::_InputArray::_InputArray(local_a8,(MatExpr *)local_448);
    cv::imshow((string *)&local_468,local_a8);
    cv::MatExpr::~MatExpr((MatExpr *)local_448);
    cv::MatExpr::~MatExpr((MatExpr *)local_208);
    std::__cxx11::string::~string((string *)&local_468);
    sdf::RenderDepth(&Tcam,0x1e0,0x280,&local_528,0x20,10.0,0.4,0.05,&geometry,&Depthmap);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_208,"Depth",(allocator<char> *)local_488);
    cv::operator/((Mat *)local_448,10.0);
    cv::_InputArray::_InputArray((_InputArray *)&local_468,(MatExpr *)local_448);
    cv::imshow((string *)local_208,(_InputArray *)&local_468);
    cv::MatExpr::~MatExpr((MatExpr *)local_448);
    std::__cxx11::string::~string((string *)local_208);
    cVar2 = cv::waitKey(2);
    if (((cVar2 == '\x1b') || (cVar2 == 'q')) || (cVar2 == 'G')) break;
    uVar5 = (ulong)((int)local_548 + 1);
    uVar6 = extraout_XMM0_Dc_00;
    uVar7 = extraout_XMM0_Dd_00;
  }
  exit(0);
}

Assistant:

int main( int argc, char* argv[] )
{

//-----------------------------------------------------------------------------    
// Define geometry of the world
//-------------------------------------------------------------------------
    std::vector<sdf::Primitive*> geometry;
    Eigen::Vector4d geometryParam;

    // Create the room
    Eigen::Affine3d T = Eigen::Affine3d::Identity();
    T.translation() = Eigen::Vector3d(0.0, 0.0, -1.0);
    geometryParam << 4.0, 4.0, 8.0, 0.0; //dimensions in X Y Z
    geometry.push_back(new sdf::Box( sdf::bool_union, T, geometryParam , true)); //the last flag flips the sign of the box

    // Add a box inside
    T = Eigen::Affine3d::Identity();
    geometryParam << 1.0, 2.0, 0.5, 0.0; //dimensions in X Y Z
    T.translation() = Eigen::Vector3d(-1.0, 1.0, 2.2);
    T.linear() = (  Eigen::AngleAxisd(-M_PI*30/180, Eigen::Vector3d::UnitY())).toRotationMatrix(); 
    geometry.push_back(new sdf::Box( sdf::bool_union, T, geometryParam , false));
        
    //Add a Sphere
    T = Eigen::Affine3d::Identity();
    T.translation() = Eigen::Vector3d(1.0, 1.5, 2.0);
    geometryParam << 0.5, 0.0, 0.0, 0.0; // Radius
    geometry.push_back(new sdf::Sphere( sdf::bool_union, T, geometryParam , false));
    T = Eigen::Affine3d::Identity();
   
    //Add another Box
    geometryParam << 0.6, 0.6, 0.6, 0.0; //dimensions in X Y Z
    T.translation() = Eigen::Vector3d(0.5, 2-0.6, 0.5);
    T.linear() = (  Eigen::AngleAxisd(M_PI*10/180, Eigen::Vector3d::UnitY())).toRotationMatrix(); 
    geometry.push_back(new sdf::Box( sdf::bool_union, T, geometryParam , false));
    T = Eigen::Affine3d::Identity();

    //Add a torus
    T.translation() = Eigen::Vector3d(0.5, 0, 2.25);
    geometryParam << 0.50, 0.1, 0.0, 0.0; // radius of ring, radius of cross-section
    geometry.push_back(new sdf::Torus( sdf::bool_union, T, geometryParam , false));
//-----------------------------------------------------------------------------    
//Define a camera to use as sensor
//-----------------------------------------------------------------------------    
    Eigen::Affine3d Tcam = Eigen::Affine3d::Identity();

    float fx = 300;
    float fy = 300;
    float cx = 319.5;
    float cy = 239.5;

    // focalx,focaly,centerx,centery (image size is determined by Render() fcn )
    Eigen::Vector4f cam_params(fx, fy, cx, cy);

    cv::Mat Depthmap;
    cv::Mat Normalmap;

//-----------------------------------------------------------------------------    
//Do some rendering and animation
//-----------------------------------------------------------------------------    
    // A simple animation loop
      
    for (int i = -150; i < 60; ++i)
    {
      //time steps      
      double t = double(i);

      // move the camera in an elliptic 3D spiral with pure translation (X Y Z)
      Tcam.translation() = Eigen::Vector3d( 
          cos(4*M_PI*t/180), 
          0.6*sin(4*M_PI*t/180), 
          t*0.01);

      //change the rotation for one of the objects at each iteration
      T.linear() = ( 
                    //Eigen::AngleAxisd(i*M_PI/50, Eigen::Vector3d::UnitZ()) *   
                    //Eigen::AngleAxisd(i*M_PI/50, Eigen::Vector3d::UnitY()) * 
                    Eigen::AngleAxisd(i*M_PI/50, Eigen::Vector3d::UnitX()) 
                    ).toRotationMatrix(); //rotation about X 
      geometry[4]->transformation = T;

      
      //Render Normal-map from synthetic environment 
      sdf::RenderNormal(Tcam, 480, 640, cam_params, 32, 10, 0.05, geometry,Normalmap);
      cv::imshow("Normals", 0.5-Normalmap*0.5);
    
      //Render Depth image from synthetic environment     
      sdf::RenderDepth(Tcam, 480, 640, cam_params, 32, 10, 0.4, 0.05, geometry,Depthmap);      
      cv::imshow("Depth", Depthmap/10.0);
      char q = cv::waitKey(2);

    if(q == 'q' || q  == 27 || q  == 71 ) { exit(0); }

    }
    cv::waitKey();
   return 0;
}